

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void usage(string *binaryName)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"MAP to JSON converter v0.0.1",0x1c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Usage: ",7);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(binaryName->_M_dataplus)._M_p,
                      binaryName->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," <MAP filename>",0xf);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void usage(std::string binaryName)
{
    std::cout << "MAP to JSON converter v0.0.1" << std::endl;
    std::cout << "Usage: " << binaryName << " <MAP filename>" << std::endl;
}